

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

const_reference __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::operator[](basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *this,size_type idx)

{
  bool bVar1;
  reference pvVar2;
  type_error *__return_storage_ptr__;
  char *pcVar3;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  size_type local_18;
  size_type idx_local;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_local;
  
  local_18 = idx;
  idx_local = (size_type)this;
  bVar1 = is_array(this);
  if (!bVar1) {
    __return_storage_ptr__ = (type_error *)__cxa_allocate_exception(0x20);
    pcVar3 = type_name(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,pcVar3,&local_59);
    std::operator+(&local_38,"cannot use operator[] with a numeric argument with ",&local_58);
    detail::type_error::create(__return_storage_ptr__,0x131,&local_38);
    __cxa_throw(__return_storage_ptr__,&detail::type_error::typeinfo,detail::type_error::~type_error
               );
  }
  pvVar2 = std::
           vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
           ::operator[]((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                         *)(this->m_value).object,local_18);
  return pvVar2;
}

Assistant:

const_reference operator[](size_type idx) const
    {
        // const operator[] only works for arrays
        if (JSON_LIKELY(is_array()))
        {
            return m_value.array->operator[](idx);
        }

        JSON_THROW(type_error::create(305, "cannot use operator[] with a numeric argument with " + std::string(type_name())));
    }